

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# minilua.c
# Opt level: O0

int load_aux(lua_State *L,int status)

{
  int in_ESI;
  lua_State *in_RDI;
  int in_stack_0000001c;
  lua_State *in_stack_00000020;
  undefined4 local_4;
  
  if (in_ESI == 0) {
    local_4 = 1;
  }
  else {
    lua_pushnil(in_RDI);
    lua_insert(in_stack_00000020,in_stack_0000001c);
    local_4 = 2;
  }
  return local_4;
}

Assistant:

static int load_aux(lua_State*L,int status){
if(status==0)
return 1;
else{
lua_pushnil(L);
lua_insert(L,-2);
return 2;
}
}